

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrie.cpp
# Opt level: O2

UStringTrieResult __thiscall icu_63::UCharsTrie::nextImpl(UCharsTrie *this,UChar *pos,int32_t uchar)

{
  UChar UVar1;
  uint uVar2;
  uint uVar3;
  UStringTrieResult UVar4;
  UChar *pos_00;
  uint length;
  
  pos_00 = pos + 1;
  uVar3 = (ushort)*pos & 0x3f;
  uVar2 = (uint)(ushort)*pos;
  while( true ) {
    length = uVar2;
    if (length < 0x30) {
      UVar4 = branchNext(this,pos_00,length,uchar);
      return UVar4;
    }
    if (length < 0x40) break;
    if (0x7fff < length) goto LAB_002930aa;
    uVar2 = uVar3;
    if (0x403f < length) {
      pos_00 = pos_00 + (ulong)(0x7fbf < length) + 1;
    }
  }
  if ((uint)(ushort)*pos_00 == uchar) {
    this->remainingMatchLength_ = length - 0x31;
    this->pos_ = pos_00 + 1;
    if (length != 0x30) {
      return USTRINGTRIE_NO_VALUE;
    }
    UVar1 = pos_00[1];
    if ((ushort)UVar1 < 0x40) {
      return USTRINGTRIE_NO_VALUE;
    }
    return (ushort)UVar1 >> 0xf ^ USTRINGTRIE_INTERMEDIATE_VALUE;
  }
LAB_002930aa:
  this->pos_ = (char16_t *)0x0;
  return USTRINGTRIE_NO_MATCH;
}

Assistant:

UStringTrieResult
UCharsTrie::nextImpl(const UChar *pos, int32_t uchar) {
    int32_t node=*pos++;
    for(;;) {
        if(node<kMinLinearMatch) {
            return branchNext(pos, node, uchar);
        } else if(node<kMinValueLead) {
            // Match the first of length+1 units.
            int32_t length=node-kMinLinearMatch;  // Actual match length minus 1.
            if(uchar==*pos++) {
                remainingMatchLength_=--length;
                pos_=pos;
                return (length<0 && (node=*pos)>=kMinValueLead) ?
                        valueResult(node) : USTRINGTRIE_NO_VALUE;
            } else {
                // No match.
                break;
            }
        } else if(node&kValueIsFinal) {
            // No further matching units.
            break;
        } else {
            // Skip intermediate value.
            pos=skipNodeValue(pos, node);
            node&=kNodeTypeMask;
        }
    }
    stop();
    return USTRINGTRIE_NO_MATCH;
}